

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter_server_test.cc
# Opt level: O0

void __thiscall xLearn::KVStoreTest_GetServerId_Test::TestBody(KVStoreTest_GetServerId_Test *this)

{
  undefined1 uVar1;
  bool bVar2;
  char *pcVar3;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  KVStore store;
  unsigned_long *in_stack_fffffffffffffd00;
  undefined7 in_stack_fffffffffffffd08;
  undefined1 in_stack_fffffffffffffd0f;
  char *in_stack_fffffffffffffd10;
  char *in_stack_fffffffffffffd18;
  size_t in_stack_fffffffffffffdd8;
  index_t feat_id;
  undefined7 in_stack_fffffffffffffde0;
  undefined1 in_stack_fffffffffffffde7;
  AssertHelper local_208;
  Message local_200;
  undefined8 local_1f8;
  char *local_1f0;
  AssertionResult local_1e8;
  AssertHelper local_1d8;
  Message local_1d0;
  undefined8 local_1c8;
  size_t local_1c0;
  AssertionResult local_1b8;
  AssertHelper local_1a8;
  Message local_1a0;
  undefined8 local_198;
  size_t local_190;
  AssertionResult local_188;
  AssertHelper local_178;
  Message local_170;
  undefined8 local_168;
  size_t local_160;
  AssertionResult local_158;
  AssertHelper local_148;
  Message local_140;
  undefined8 local_138;
  size_t local_130;
  AssertionResult local_128;
  AssertHelper local_118;
  Message local_110;
  undefined8 local_108;
  size_t local_100;
  AssertionResult local_f8;
  AssertHelper local_e8;
  Message local_e0;
  undefined8 local_d8;
  size_t local_d0;
  AssertionResult local_c8;
  AssertHelper local_b8;
  Message local_b0;
  undefined8 local_a8;
  size_t local_a0;
  AssertionResult local_98;
  AssertHelper local_88;
  Message local_80;
  undefined8 local_78;
  size_t local_70;
  AssertionResult local_68;
  AssertHelper local_58;
  Message local_50;
  undefined8 local_48;
  size_t local_40;
  AssertionResult local_38 [2];
  KVStore local_18;
  
  KVStore::KVStore(&local_18);
  KVStore::Initialize((KVStore *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
                      in_stack_fffffffffffffdd8);
  feat_id = (index_t)(in_stack_fffffffffffffdd8 >> 0x20);
  local_40 = KVStore::GetServerId
                       ((KVStore *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
                        feat_id);
  local_48 = 0;
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            (in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
             (unsigned_long *)CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
             in_stack_fffffffffffffd00);
  uVar1 = testing::AssertionResult::operator_cast_to_bool(local_38);
  if (!(bool)uVar1) {
    testing::Message::Message(&local_50);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x137740);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/distributed/parameter_server_test.cc"
               ,0x1e,pcVar3);
    feat_id = (index_t)((ulong)pcVar3 >> 0x20);
    testing::internal::AssertHelper::operator=(&local_58,&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    testing::Message::~Message((Message *)0x1377a3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1377fb);
  local_70 = KVStore::GetServerId((KVStore *)CONCAT17(uVar1,in_stack_fffffffffffffde0),feat_id);
  local_78 = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            (in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
             (unsigned_long *)CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
             in_stack_fffffffffffffd00);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_68);
  if (!bVar2) {
    testing::Message::Message(&local_80);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1378cf);
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/distributed/parameter_server_test.cc"
               ,0x1f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_88,&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    testing::Message::~Message((Message *)0x137932);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13798a);
  local_a0 = KVStore::GetServerId((KVStore *)CONCAT17(uVar1,in_stack_fffffffffffffde0),feat_id);
  local_a8 = 2;
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            (in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
             (unsigned_long *)CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
             in_stack_fffffffffffffd00);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_98);
  if (!bVar2) {
    testing::Message::Message(&local_b0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x137a5e);
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/distributed/parameter_server_test.cc"
               ,0x20,pcVar3);
    testing::internal::AssertHelper::operator=(&local_b8,&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    testing::Message::~Message((Message *)0x137ac1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x137b19);
  local_d0 = KVStore::GetServerId((KVStore *)CONCAT17(uVar1,in_stack_fffffffffffffde0),feat_id);
  local_d8 = 0;
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            (in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
             (unsigned_long *)CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
             in_stack_fffffffffffffd00);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_c8);
  if (!bVar2) {
    testing::Message::Message(&local_e0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x137bed);
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/distributed/parameter_server_test.cc"
               ,0x21,pcVar3);
    testing::internal::AssertHelper::operator=(&local_e8,&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    testing::Message::~Message((Message *)0x137c50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x137ca8);
  local_100 = KVStore::GetServerId((KVStore *)CONCAT17(uVar1,in_stack_fffffffffffffde0),feat_id);
  local_108 = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            (in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
             (unsigned_long *)CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
             in_stack_fffffffffffffd00);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_f8);
  if (!bVar2) {
    testing::Message::Message(&local_110);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x137d7c);
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/distributed/parameter_server_test.cc"
               ,0x22,pcVar3);
    testing::internal::AssertHelper::operator=(&local_118,&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    testing::Message::~Message((Message *)0x137ddf);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x137e37);
  local_130 = KVStore::GetServerId((KVStore *)CONCAT17(uVar1,in_stack_fffffffffffffde0),feat_id);
  local_138 = 2;
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            (in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
             (unsigned_long *)CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
             in_stack_fffffffffffffd00);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_128);
  if (!bVar2) {
    testing::Message::Message(&local_140);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x137eff);
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/distributed/parameter_server_test.cc"
               ,0x23,pcVar3);
    testing::internal::AssertHelper::operator=(&local_148,&local_140);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    testing::Message::~Message((Message *)0x137f5c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x137fb4);
  local_160 = KVStore::GetServerId((KVStore *)CONCAT17(uVar1,in_stack_fffffffffffffde0),feat_id);
  local_168 = 0;
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            (in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
             (unsigned_long *)CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
             in_stack_fffffffffffffd00);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_158);
  if (!bVar2) {
    testing::Message::Message(&local_170);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x13807c);
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/distributed/parameter_server_test.cc"
               ,0x24,pcVar3);
    testing::internal::AssertHelper::operator=(&local_178,&local_170);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    testing::Message::~Message((Message *)0x1380d9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x138131);
  local_190 = KVStore::GetServerId((KVStore *)CONCAT17(uVar1,in_stack_fffffffffffffde0),feat_id);
  local_198 = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            (in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
             (unsigned_long *)CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
             in_stack_fffffffffffffd00);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_188);
  if (!bVar2) {
    testing::Message::Message(&local_1a0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1381f9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/distributed/parameter_server_test.cc"
               ,0x25,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1a8,&local_1a0);
    testing::internal::AssertHelper::~AssertHelper(&local_1a8);
    testing::Message::~Message((Message *)0x138256);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1382ae);
  local_1c0 = KVStore::GetServerId((KVStore *)CONCAT17(uVar1,in_stack_fffffffffffffde0),feat_id);
  local_1c8 = 2;
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            (in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
             (unsigned_long *)CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
             in_stack_fffffffffffffd00);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_1b8);
  if (!bVar2) {
    testing::Message::Message(&local_1d0);
    in_stack_fffffffffffffd18 =
         testing::AssertionResult::failure_message((AssertionResult *)0x138376);
    testing::internal::AssertHelper::AssertHelper
              (&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/distributed/parameter_server_test.cc"
               ,0x26,in_stack_fffffffffffffd18);
    testing::internal::AssertHelper::operator=(&local_1d8,&local_1d0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d8);
    testing::Message::~Message((Message *)0x1383d3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13842b);
  local_1f0 = (char *)KVStore::GetServerId
                                ((KVStore *)CONCAT17(uVar1,in_stack_fffffffffffffde0),feat_id);
  local_1f8 = 0;
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            (in_stack_fffffffffffffd18,local_1f0,
             (unsigned_long *)CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
             in_stack_fffffffffffffd00);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_1e8);
  if (!bVar2) {
    testing::Message::Message(&local_200);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1384f3);
    testing::internal::AssertHelper::AssertHelper
              (&local_208,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/distributed/parameter_server_test.cc"
               ,0x27,pcVar3);
    testing::internal::AssertHelper::operator=(&local_208,&local_200);
    testing::internal::AssertHelper::~AssertHelper(&local_208);
    testing::Message::~Message((Message *)0x138550);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1385a5);
  KVStore::~KVStore(&local_18);
  return;
}

Assistant:

TEST(KVStoreTest, GetServerId) {
  KVStore store;
  store.Initialize(3);
  EXPECT_EQ(store.GetServerId((index_t)0), (size_t)0);
  EXPECT_EQ(store.GetServerId((index_t)1), (size_t)1);
  EXPECT_EQ(store.GetServerId((index_t)2), (size_t)2);
  EXPECT_EQ(store.GetServerId((index_t)3), (size_t)0);
  EXPECT_EQ(store.GetServerId((index_t)4), (size_t)1);
  EXPECT_EQ(store.GetServerId((index_t)5), (size_t)2);
  EXPECT_EQ(store.GetServerId((index_t)6), (size_t)0);
  EXPECT_EQ(store.GetServerId((index_t)7), (size_t)1);
  EXPECT_EQ(store.GetServerId((index_t)8), (size_t)2);
  EXPECT_EQ(store.GetServerId((index_t)9), (size_t)0);
}